

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O1

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitMemoryCopy
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,MemoryCopy *curr)

{
  Memory *pMVar1;
  Memory *pMVar2;
  
  pMVar1 = Module::getMemory(this->wasm,(Name)(curr->destMemory).super_IString.str);
  pMVar2 = Module::getMemory(this->wasm,(Name)(curr->sourceMemory).super_IString.str);
  if ((pMVar1->addressType).id == (pMVar2->addressType).id) {
    pMVar1 = Module::getMemory(this->wasm,(Name)(curr->destMemory).super_IString.str);
    IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
              ((ConstraintCollector *)this,&curr->dest,(Type)(pMVar1->addressType).id);
    pMVar1 = Module::getMemory(this->wasm,(Name)(curr->sourceMemory).super_IString.str);
    IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
              ((ConstraintCollector *)this,&curr->source,(Type)(pMVar1->addressType).id);
    pMVar1 = Module::getMemory(this->wasm,(Name)(curr->destMemory).super_IString.str);
    IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
              ((ConstraintCollector *)this,&curr->size,(Type)(pMVar1->addressType).id);
    return;
  }
  __assert_fail("wasm.getMemory(curr->destMemory)->addressType == wasm.getMemory(curr->sourceMemory)->addressType"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/child-typer.h"
                ,0x122,
                "void wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitMemoryCopy(MemoryCopy *) [Subtype = wasm::IRBuilder::ChildPopper::ConstraintCollector]"
               );
}

Assistant:

void visitMemoryCopy(MemoryCopy* curr) {
    assert(wasm.getMemory(curr->destMemory)->addressType ==
           wasm.getMemory(curr->sourceMemory)->addressType);
    notePointer(&curr->dest, curr->destMemory);
    notePointer(&curr->source, curr->sourceMemory);
    notePointer(&curr->size, curr->destMemory);
  }